

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O2

void __thiscall QpVector::reset(QpVector *this)

{
  pointer piVar1;
  pointer pdVar2;
  HighsInt i;
  long lVar3;
  
  piVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar3 < this->num_nz; lVar3 = lVar3 + 1) {
    pdVar2[piVar1[lVar3]] = 0.0;
    piVar1[lVar3] = 0;
  }
  this->num_nz = 0;
  return;
}

Assistant:

void reset() {
    for (HighsInt i = 0; i < num_nz; i++) {
      value[index[i]] = 0;
      index[i] = 0;
    }
    num_nz = 0;
  }